

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<void_*,_bool>,_phmap::priv::HashEq<void_*,_void>::Hash,_phmap::priv::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_bool>_>_>
::initialize_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<void_*,_bool>,_phmap::priv::HashEq<void_*,_void>::Hash,_phmap::priv::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_bool>_>_>
                   *this,size_t new_capacity)

{
  ctrl_t *__s;
  ulong uVar1;
  Layout LVar2;
  
  if (new_capacity == 0) {
    __assert_fail("new_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x7dd,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<void *, bool>, phmap::priv::HashEq<void *>::Hash, phmap::priv::HashEq<void *>::Eq, std::allocator<std::pair<void *const, bool>>>::initialize_slots(size_t) [Policy = phmap::priv::FlatHashMapPolicy<void *, bool>, Hash = phmap::priv::HashEq<void *>::Hash, Eq = phmap::priv::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, bool>>]"
                 );
  }
  LVar2 = MakeLayout(new_capacity);
  uVar1 = LVar2.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<void_*,_bool>_>.
          size_[0] + 7 & 0xfffffffffffffff8;
  __s = (ctrl_t *)
        Allocate<8ul,std::allocator<std::pair<void*const,bool>>>
                  ((allocator<std::pair<void_*const,_bool>_> *)&this->settings_,
                   LVar2.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<void_*,_bool>_>
                   .size_[1] * 0x10 + uVar1);
  if (((ulong)__s & 7) == 0) {
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)(__s + uVar1);
    memset(__s,0x80,new_capacity + 0x10);
    this->ctrl_[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, phmap::priv::map_slot_type<void *, bool>>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::priv::map_slot_type<void *, bool>>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
               );
}

Assistant:

void initialize_slots(size_t new_capacity) {
        assert(new_capacity);
        if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value && 
            slots_ == nullptr) {
            infoz_ = Sample();
        }

        auto layout = MakeLayout(new_capacity);
        char* mem = static_cast<char*>(
            Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
        ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
        slots_ = layout.template Pointer<1>(mem);
        reset_ctrl(new_capacity);
        reset_growth_left(new_capacity);
        infoz_.RecordStorageChanged(size_, new_capacity);
    }